

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ExtensionDeclarationRequireDeclarationsForAll_Test::TestBody
          (CommandLineInterfaceTest_ExtensionDeclarationRequireDeclarationsForAll_Test *this)

{
  string_view local_78 [2];
  allocator<char> local_51;
  string local_50;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_ExtensionDeclarationRequireDeclarationsForAll_Test *local_10;
  CommandLineInterfaceTest_ExtensionDeclarationRequireDeclarationsForAll_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    syntax = \"proto2\";\n    package foo;\n    message Foo {\n      extensions 4000 to max [ declaration = {\n          number: 5000,\n          full_name: \".foo.o\"\n          type: \"int32\"\n        }];\n    }\n\n    extend Foo {\n      optional int32 o = 5000;\n      repeated int32 i = 9000;\n    }"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto",&local_51);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_78,
             "Missing extension declaration for field foo.i with number 9000 in extendee message foo.Foo"
            );
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_78[0]);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest,
       ExtensionDeclarationRequireDeclarationsForAll) {
  CreateTempFile("foo.proto", R"schema(
    syntax = "proto2";
    package foo;
    message Foo {
      extensions 4000 to max [ declaration = {
          number: 5000,
          full_name: ".foo.o"
          type: "int32"
        }];
    }

    extend Foo {
      optional int32 o = 5000;
      repeated int32 i = 9000;
    })schema");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Missing extension declaration for field foo.i with number 9000 in "
      "extendee message foo.Foo");
}